

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_su2(REF_GRID ref_grid,char *filename)

{
  REF_CELL_TYPE RVar1;
  int iVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  uint uVar5;
  REF_STATUS RVar6;
  int local_164;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT nqua_1;
  REF_INT ntri_1;
  REF_INT max_faceid_1;
  REF_INT min_faceid_1;
  REF_INT faceid_1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT nedg;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT faceid;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ugrid_nodes_1 [6];
  REF_INT ugrid_nodes [5];
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT nqua;
  REF_INT ntri;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnode;
  REF_INT group;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT *local_50;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x4da,
           "ref_export_su2","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    if (*(int *)(filename_local + 0x108) == 0) {
      fprintf((FILE *)ref_node,"NDIME= 3\n");
    }
    else {
      fprintf((FILE *)ref_node,"NDIME= 2\n");
    }
    uVar5 = ref_node_compact((REF_NODE)ref_cell,&n2o,&local_50);
    if (uVar5 == 0) {
      fprintf((FILE *)ref_node,"NPOIN= %d\n",(ulong)ref_cell->type);
      if (*(int *)(filename_local + 0x108) == 0) {
        for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
          fprintf((FILE *)ref_node," %.16e %.16e %.16e\n",
                  *(undefined8 *)(ref_cell->c2n + (long)(local_50[o2n._4_4_] * 0xf) * 2),
                  *(undefined8 *)(ref_cell->c2n + (long)(local_50[o2n._4_4_] * 0xf + 1) * 2),
                  *(undefined8 *)(ref_cell->c2n + (long)(local_50[o2n._4_4_] * 0xf + 2) * 2));
        }
      }
      else {
        for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
          fprintf((FILE *)ref_node," %.16e %.16e\n",
                  *(undefined8 *)(ref_cell->c2n + (long)(local_50[o2n._4_4_] * 0xf) * 2),
                  *(undefined8 *)(ref_cell->c2n + (long)(local_50[o2n._4_4_] * 0xf + 1) * 2));
        }
      }
      if (*(int *)(filename_local + 0x108) == 0) {
        fprintf((FILE *)ref_node,"NELEM= %d\n",
                (ulong)(uint)(*(int *)(*(long *)(filename_local + 0x50) + 0x28) +
                              *(int *)(*(long *)(filename_local + 0x58) + 0x28) +
                              *(int *)(*(long *)(filename_local + 0x60) + 0x28) +
                             *(int *)(*(long *)(filename_local + 0x68) + 0x28)));
        ref_private_macro_code_rss = 8;
        pRStack_38 = *(REF_CELL *)(filename_local + 0x50);
        while (ref_private_macro_code_rss < 0x10) {
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if (RVar6 == 0) {
              switch(pRStack_38->type) {
              case REF_CELL_EDG:
              case REF_CELL_ED2:
              case REF_CELL_ED3:
              case REF_CELL_TRI:
              case REF_CELL_TR2:
              case REF_CELL_TR3:
              case REF_CELL_QUA:
              case REF_CELL_QU2:
              case REF_CELL_TE2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                min_faceid = 6;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x53d,"ref_export_su2",6,"3D SU2 element");
                return min_faceid;
              case REF_CELL_TET:
                fprintf((FILE *)ref_node,"10");
                break;
              case REF_CELL_PYR:
                fprintf((FILE *)ref_node,"14");
                RVar4 = nodes[0];
                RVar3 = cell;
                cell = node_per;
                node_per = RVar3;
                nodes[0] = nodes[1];
                nodes[1] = nodes[2];
                nodes[2] = RVar4;
                break;
              case REF_CELL_PRI:
                fprintf((FILE *)ref_node,"13");
                RVar4 = nodes[1];
                RVar3 = cell;
                faceid = cell;
                ref_private_macro_code_rss_2 = node_per;
                ugrid_nodes_1[0] = nodes[0];
                ugrid_nodes_1[1] = nodes[1];
                ugrid_nodes_1[2] = nodes[2];
                ugrid_nodes_1[3] = nodes[3];
                cell = node_per;
                node_per = RVar3;
                nodes[1] = nodes[2];
                nodes[2] = RVar4;
                break;
              case REF_CELL_HEX:
                fprintf((FILE *)ref_node,"12");
              }
              for (o2n._4_4_ = 0; o2n._4_4_ < pRStack_38->node_per; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
          pRStack_38 = *(REF_CELL *)(filename_local + (long)ref_private_macro_code_rss * 8 + 0x10);
        }
      }
      else {
        fprintf((FILE *)ref_node,"NELEM= %d\n",
                (ulong)(uint)(*(int *)(*(long *)(filename_local + 0x28) + 0x28) +
                             *(int *)(*(long *)(filename_local + 0x40) + 0x28)));
        ref_private_macro_code_rss = 3;
        pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
        while (ref_private_macro_code_rss < 8) {
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if (RVar6 == 0) {
              RVar1 = pRStack_38->type;
              if (RVar1 < REF_CELL_TRI) {
code_r0x002782a2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x510,"ref_export_su2",6,"2D SU2 element");
                return 6;
              }
              if (RVar1 == REF_CELL_TRI) {
                fprintf((FILE *)ref_node,"5");
              }
              else {
                if (RVar1 - REF_CELL_TR2 < 2) goto code_r0x002782a2;
                if (RVar1 == REF_CELL_QUA) {
                  fprintf((FILE *)ref_node,"9");
                }
                else if (RVar1 - REF_CELL_QU2 < 9) goto code_r0x002782a2;
              }
              for (o2n._4_4_ = 0; o2n._4_4_ < pRStack_38->node_per; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
          pRStack_38 = *(REF_CELL *)(filename_local + (long)ref_private_macro_code_rss * 8 + 0x10);
        }
      }
      if (*(int *)(filename_local + 0x108) == 0) {
        uVar5 = ref_export_faceid_range((REF_GRID)filename_local,&ntri_1,&nqua_1);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x56b,"ref_export_su2",(ulong)uVar5,"range");
          return uVar5;
        }
        fprintf((FILE *)ref_node,"NMARK= %d\n",(ulong)((nqua_1 - ntri_1) + 1));
        for (max_faceid_1 = ntri_1; max_faceid_1 <= nqua_1; max_faceid_1 = max_faceid_1 + 1) {
          pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
          iVar2 = pRStack_38->node_per;
          ref_private_macro_code_rss_4 = 0;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid_1)) {
              ref_private_macro_code_rss_4 = ref_private_macro_code_rss_4 + 1;
            }
          }
          pRStack_38 = *(REF_CELL *)(filename_local + 0x40);
          iVar2 = pRStack_38->node_per;
          local_164 = 0;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid_1)) {
              local_164 = local_164 + 1;
            }
          }
          fprintf((FILE *)ref_node,"MARKER_TAG= %d\n",(ulong)(uint)max_faceid_1);
          fprintf((FILE *)ref_node,"MARKER_ELEMS= %d\n",
                  (ulong)(uint)(ref_private_macro_code_rss_4 + local_164));
          pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
          iVar2 = pRStack_38->node_per;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid_1)) {
              fprintf((FILE *)ref_node,"5");
              for (o2n._4_4_ = 0; o2n._4_4_ < iVar2; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
          pRStack_38 = *(REF_CELL *)(filename_local + 0x40);
          iVar2 = pRStack_38->node_per;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid_1)) {
              fprintf((FILE *)ref_node,"9");
              for (o2n._4_4_ = 0; o2n._4_4_ < iVar2; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
      }
      else {
        min_faceid_1 = ref_export_cell_id_range
                                 (*(REF_CELL *)(filename_local + 0x10),&nedg,
                                  &ref_private_macro_code_rss_3);
        if (min_faceid_1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x54c,"ref_export_su2",(ulong)(uint)min_faceid_1,"range");
          return min_faceid_1;
        }
        fprintf((FILE *)ref_node,"NMARK= %d\n",(ulong)((ref_private_macro_code_rss_3 - nedg) + 1));
        for (max_faceid = nedg; max_faceid <= ref_private_macro_code_rss_3;
            max_faceid = max_faceid + 1) {
          pRStack_38 = *(REF_CELL *)(filename_local + 0x10);
          iVar2 = pRStack_38->node_per;
          faceid_1 = 0;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid)) {
              faceid_1 = faceid_1 + 1;
            }
          }
          fprintf((FILE *)ref_node,"MARKER_TAG= %d\n",(ulong)(uint)max_faceid);
          fprintf((FILE *)ref_node,"MARKER_ELEMS= %d\n",(ulong)(uint)faceid_1);
          pRStack_38 = *(REF_CELL *)(filename_local + 0x10);
          iVar2 = pRStack_38->node_per;
          for (nnode = 0; nnode < pRStack_38->max; nnode = nnode + 1) {
            RVar6 = ref_cell_nodes(pRStack_38,nnode,&cell);
            if ((RVar6 == 0) && ((&cell)[iVar2] == max_faceid)) {
              fprintf((FILE *)ref_node,"3");
              for (o2n._4_4_ = 0; o2n._4_4_ < iVar2; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
      }
      if (local_50 != (REF_INT *)0x0) {
        free(local_50);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose((FILE *)ref_node);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x4e2,"ref_export_su2",(ulong)uVar5,"compact");
      ref_grid_local._4_4_ = uVar5;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_su2(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT group;
  REF_INT nnode;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  if (ref_grid_twod(ref_grid)) {
    fprintf(file, "NDIME= 2\n");
  } else {
    fprintf(file, "NDIME= 3\n");
  }

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  nnode = ref_node_n(ref_node);
  fprintf(file, "NPOIN= %d\n", nnode);

  if (ref_grid_twod(ref_grid)) {
    for (node = 0; node < ref_node_n(ref_node); node++)
      fprintf(file, " %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]),
              ref_node_xyz(ref_node, 1, n2o[node]));
  } else {
    for (node = 0; node < ref_node_n(ref_node); node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, n2o[node]),
              ref_node_xyz(ref_node, 1, n2o[node]),
              ref_node_xyz(ref_node, 2, n2o[node]));
  }

  if (ref_grid_twod(ref_grid)) {
    REF_INT ntri = ref_cell_n(ref_grid_tri(ref_grid));
    REF_INT nqua = ref_cell_n(ref_grid_qua(ref_grid));

    fprintf(file, "NELEM= %d\n", ntri + nqua);
    /* uses VTK windings */
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TRI:
            fprintf(file, "5");
            break;
          case REF_CELL_QUA:
            fprintf(file, "9");
            break;
          case REF_CELL_QU2:
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_TET:
          case REF_CELL_PYR:
          case REF_CELL_PRI:
          case REF_CELL_HEX:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSS(REF_IMPLEMENT, "2D SU2 element");
            break;
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++)
          fprintf(file, " %d", o2n[nodes[node]]);
        fprintf(file, "\n");
      }
    }
  } else {
    REF_INT ntet = ref_cell_n(ref_grid_tet(ref_grid));
    REF_INT npyr = ref_cell_n(ref_grid_pyr(ref_grid));
    REF_INT npri = ref_cell_n(ref_grid_pri(ref_grid));
    REF_INT nhex = ref_cell_n(ref_grid_hex(ref_grid));

    fprintf(file, "NELEM= %d\n", ntet + npyr + npri + nhex);
    /* uses VTK windings */
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TET:
            fprintf(file, "10");
            break;
          case REF_CELL_PYR:
            fprintf(file, "14");
            VTK_PYRAMID_ORDER(nodes);
            break;
          case REF_CELL_PRI:
            fprintf(file, "13");
            VTK_WEDGE_ORDER(nodes);
            break;
          case REF_CELL_HEX:
            fprintf(file, "12");
            break;
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TRI:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_QUA:
          case REF_CELL_QU2:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSS(REF_IMPLEMENT, "3D SU2 element");
            break;
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++)
          fprintf(file, " %d", o2n[nodes[node]]);
        fprintf(file, "\n");
      }
    }
  }

  if (ref_grid_twod(ref_grid)) {
    REF_INT faceid, min_faceid, max_faceid;
    REF_INT nedg;
    RSS(ref_export_cell_id_range(ref_grid_edg(ref_grid), &min_faceid,
                                 &max_faceid),
        "range");
    fprintf(file, "NMARK= %d\n", max_faceid - min_faceid + 1);

    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      ref_cell = ref_grid_edg(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      nedg = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          nedg++;
        }
      }
      fprintf(file, "MARKER_TAG= %d\n", faceid);
      fprintf(file, "MARKER_ELEMS= %d\n", nedg);

      ref_cell = ref_grid_edg(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          fprintf(file, "3");
          for (node = 0; node < node_per; node++)
            fprintf(file, " %d", o2n[nodes[node]]);
          fprintf(file, "\n");
        }
      }
    }

  } else {
    REF_INT faceid, min_faceid, max_faceid;
    REF_INT ntri;
    REF_INT nqua;
    RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
    fprintf(file, "NMARK= %d\n", max_faceid - min_faceid + 1);

    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      ref_cell = ref_grid_tri(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      ntri = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          ntri++;
        }
      }

      ref_cell = ref_grid_qua(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      nqua = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          nqua++;
        }
      }

      fprintf(file, "MARKER_TAG= %d\n", faceid);
      fprintf(file, "MARKER_ELEMS= %d\n", ntri + nqua);

      ref_cell = ref_grid_tri(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          fprintf(file, "5");
          for (node = 0; node < node_per; node++)
            fprintf(file, " %d", o2n[nodes[node]]);
          fprintf(file, "\n");
        }
      }

      ref_cell = ref_grid_qua(ref_grid);
      node_per = ref_cell_node_per(ref_cell);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          fprintf(file, "9");
          for (node = 0; node < node_per; node++)
            fprintf(file, " %d", o2n[nodes[node]]);
          fprintf(file, "\n");
        }
      }
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}